

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_examples.c
# Opt level: O1

void test14_should_not_be_parsed(void)

{
  cJSON *item;
  long in_FS_OFFSET;
  char test_14 [179];
  char acStack_c8 [184];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(acStack_c8,
         "{\"Image\":{\"Width\":800,\"Height\":600,\"Title\":\"Viewfrom15thFloor\",\"Thumbnail\":{\"Url\":\"http:/*www.example.com/image/481989943\",\"Height\":125,\"Width\":\"100\"},\"IDs\":[116,943,234,38793]}}"
         ,0xb3);
  item = cJSON_ParseWithLengthOpts(acStack_c8,0xb1,(char **)0x0,0);
  if (item != (cJSON *)0x0) {
    UnityFail("Should not continue after buffer_length is reached.",0xf5);
    cJSON_Delete(item);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void test14_should_not_be_parsed(void)
{
    cJSON *tree = NULL;
    const char test_14[] = "{" \
                                "\"Image\":{" \
                                    "\"Width\":800," \
                                    "\"Height\":600," \
                                    "\"Title\":\"Viewfrom15thFloor\"," \
                                    "\"Thumbnail\":{" \
                                        "\"Url\":\"http:/*www.example.com/image/481989943\"," \
                                        "\"Height\":125," \
                                        "\"Width\":\"100\"" \
                                    "}," \
                                    "\"IDs\":[116,943,234,38793]" \
                                "}" \
                            "}";

    tree = cJSON_ParseWithLength(test_14, sizeof(test_14) - 2);
    TEST_ASSERT_NULL_MESSAGE(tree, "Should not continue after buffer_length is reached.");

    if (tree != NULL)
    {
        cJSON_Delete(tree);
    }
}